

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZEncoder.cpp
# Opt level: O2

void ZXing::Aztec::GenerateCheckWords
               (BitArray *bitArray,int totalBits,int wordSize,BitArray *messageBits)

{
  GenericGF *field;
  invalid_argument *this;
  int in_R9D;
  vector<int,_std::allocator<int>_> messageWords;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  ToInts<int,void>(&messageWords,(ZXing *)bitArray,(BitArray *)(ulong)(uint)wordSize,
                   totalBits / wordSize,0,in_R9D);
  switch(wordSize) {
  case 4:
    field = GenericGF::AztecParam();
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_48,wordSize);
    std::operator+(&local_68,"Unsupported word size ",&local_48);
    std::invalid_argument::invalid_argument(this,(string *)&local_68);
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 6:
    field = GenericGF::AztecData6();
    break;
  case 8:
    field = GenericGF::AztecData8();
    break;
  case 10:
    field = GenericGF::AztecData10();
    break;
  case 0xc:
    field = GenericGF::AztecData12();
  }
  ReedSolomonEncode(field,&messageWords,
                    ((*(int *)&(bitArray->_bits).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                     *(int *)&(bitArray->_bits).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish) + totalBits) / wordSize);
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&messageBits->_bits);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  BitArray::appendBits(messageBits,0,totalBits % wordSize);
  for (; messageWords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         messageWords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      messageWords.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = messageWords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    BitArray::appendBits
              (messageBits,
               *messageWords.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,wordSize);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&messageWords.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void GenerateCheckWords(const BitArray& bitArray, int totalBits, int wordSize, BitArray& messageBits)
{
	// bitArray is guaranteed to be a multiple of the wordSize, so no padding needed
	std::vector<int> messageWords = ToInts(bitArray, wordSize, totalBits / wordSize);
	ReedSolomonEncode(GetGFFromWordSize(wordSize), messageWords, (totalBits - bitArray.size()) / wordSize);
	int startPad = totalBits % wordSize;
	messageBits = BitArray();
	messageBits.appendBits(0, startPad);
	for (int messageWord : messageWords)
		messageBits.appendBits(messageWord, wordSize);
}